

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintDelay(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  int local_4c;
  int local_48;
  int Num_1;
  int Num;
  int c;
  Abc_Obj_t *pObjOut;
  Abc_Obj_t *pObjIn;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  pObjOut = (Abc_Obj_t *)0x0;
  _Num = (Abc_Obj_t *)0x0;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar1 = Abc_NtkIsMappedLogic(pNtk_00);
    if (iVar1 == 0) {
      Abc_Print(-1,"Delay trace works only for network mapped into standard cells.\n");
      return 1;
    }
    if (argc <= globalUtilOptind + 2) {
      if (globalUtilOptind + 1 <= argc) {
        local_48 = Nm_ManFindIdByName(pNtk_00->pManName,argv[globalUtilOptind],3);
        if (local_48 < 0) {
          local_48 = Nm_ManFindIdByName(pNtk_00->pManName,argv[globalUtilOptind],4);
        }
        if (-1 < local_48) {
          _Num = Abc_NtkObj(pNtk_00,local_48);
        }
        if (_Num == (Abc_Obj_t *)0x0) {
          Abc_Print(1,"Cannot find combinational output \"%s\".\n",argv[globalUtilOptind]);
          return 1;
        }
      }
      if (argc == globalUtilOptind + 2) {
        local_4c = Nm_ManFindIdByName(pNtk_00->pManName,argv[globalUtilOptind + 1],2);
        if (local_4c < 0) {
          local_4c = Nm_ManFindIdByName(pNtk_00->pManName,argv[globalUtilOptind + 1],5);
        }
        if (-1 < local_4c) {
          pObjOut = Abc_NtkObj(pNtk_00,local_4c);
        }
        if (pObjOut == (Abc_Obj_t *)0x0) {
          Abc_Print(1,"Cannot find combinational input \"%s\".\n",argv[globalUtilOptind + 1]);
          return 1;
        }
      }
      Abc_NtkDelayTrace(pNtk_00,_Num,pObjOut,1);
      return 0;
    }
    Abc_Print(-1,"Wrong number of auguments.\n");
  }
  Abc_Print(-2,"usage: print_delay [-h] <CO_name> <CI_name>\n");
  Abc_Print(-2,"\t            prints one critical path of the mapped network\n");
  Abc_Print(-2,"\t-h        : print the command usage\n");
  Abc_Print(-2,
            "\t<CO_name> : (optional) the sink of the critical path (primary output or flop input)\n"
           );
  Abc_Print(-2,
            "\t<CI_name> : (optional) the source of the critical path (primary input or flop output)\n"
           );
  Abc_Print(-2,"\t            (if CO and/or CI are not given, uses the most critical ones)\n");
  return 1;
}

Assistant:

int Abc_CommandPrintDelay( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pObjIn = NULL, * pObjOut = NULL;
    int c;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsMappedLogic(pNtk) )
    {
        Abc_Print( -1, "Delay trace works only for network mapped into standard cells.\n" );
        return 1;
    }
    if ( argc > globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    // collect the first name (PO name)
    if ( argc >= globalUtilOptind + 1 )
    {
        int Num = Nm_ManFindIdByName( pNtk->pManName, argv[globalUtilOptind], ABC_OBJ_PO );
        if ( Num < 0 )
            Num = Nm_ManFindIdByName( pNtk->pManName, argv[globalUtilOptind], ABC_OBJ_BI );
        if ( Num >= 0 )
            pObjOut = Abc_NtkObj( pNtk, Num );
        if ( pObjOut == NULL )
        {
            Abc_Print( 1, "Cannot find combinational output \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    // collect the second name (PI name)
    if ( argc == globalUtilOptind + 2 )
    {
        int Num = Nm_ManFindIdByName( pNtk->pManName, argv[globalUtilOptind+1], ABC_OBJ_PI );
        if ( Num < 0 )
            Num = Nm_ManFindIdByName( pNtk->pManName, argv[globalUtilOptind+1], ABC_OBJ_BO );
        if ( Num >= 0 )
            pObjIn = Abc_NtkObj( pNtk, Num );
        if ( pObjIn == NULL )
        {
            Abc_Print( 1, "Cannot find combinational input \"%s\".\n", argv[globalUtilOptind+1] );
            return 1;
        }
    }
    Abc_NtkDelayTrace( pNtk, pObjOut, pObjIn, 1 );
    return 0;

usage:
    Abc_Print( -2, "usage: print_delay [-h] <CO_name> <CI_name>\n" );
    Abc_Print( -2, "\t            prints one critical path of the mapped network\n" );
    Abc_Print( -2, "\t-h        : print the command usage\n");
    Abc_Print( -2, "\t<CO_name> : (optional) the sink of the critical path (primary output or flop input)\n");
    Abc_Print( -2, "\t<CI_name> : (optional) the source of the critical path (primary input or flop output)\n");
    Abc_Print( -2, "\t            (if CO and/or CI are not given, uses the most critical ones)\n");
    return 1;
}